

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall
Catch::JunitReporter::writeSection
          (JunitReporter *this,string *className,string *rootName,SectionNode *sectionNode,
          bool testOkToFail)

{
  StringRef text;
  StringRef text_00;
  StringRef attribute;
  StringRef name_00;
  StringRef attribute_00;
  StringRef attribute_01;
  StringRef attribute_02;
  StringRef attribute_03;
  StringRef attribute_04;
  StringRef attribute_05;
  StringRef name_01;
  StringRef name_02;
  StringRef name_03;
  StringRef name_04;
  StringRef name_05;
  StringRef name_06;
  byte bVar1;
  bool bVar2;
  ulong uVar3;
  size_type sVar4;
  char *pcVar5;
  string *str;
  string *in_RCX;
  string *in_RDX;
  JunitReporter *in_RSI;
  long in_RDI;
  byte in_R8B;
  unique_ptr<Catch::CumulativeReporterBase::SectionNode> *childNode;
  const_iterator __end1;
  const_iterator __begin1;
  vector<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
  *__range1;
  ScopedElement e;
  string name;
  JunitReporter *in_stack_fffffffffffffc38;
  SectionNode *in_stack_fffffffffffffc40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc48;
  XmlFormatting fmt;
  SectionNode *in_stack_fffffffffffffc50;
  undefined4 in_stack_fffffffffffffc58;
  XmlFormatting in_stack_fffffffffffffc5c;
  JunitReporter *in_stack_fffffffffffffc60;
  string *name_07;
  XmlWriter *in_stack_fffffffffffffc68;
  allocator<char> *in_stack_fffffffffffffc70;
  char *in_stack_fffffffffffffc78;
  XmlWriter *in_stack_fffffffffffffc80;
  char *in_stack_fffffffffffffc88;
  size_type in_stack_fffffffffffffc90;
  char *in_stack_fffffffffffffc98;
  size_type in_stack_fffffffffffffca0;
  allocator<char> local_319;
  string local_318 [32];
  unique_ptr<Catch::CumulativeReporterBase::SectionNode> *local_2f8;
  unique_ptr<Catch::CumulativeReporterBase::SectionNode> *local_2f0;
  __normal_iterator<const_Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>_*,_std::vector<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>_>_>_>
  local_2e8;
  string *local_2e0;
  string local_2d8 [55];
  undefined1 local_2a1 [49];
  string local_270 [55];
  allocator<char> local_239;
  string local_238 [87];
  undefined1 local_1e1 [81];
  string local_190 [48];
  StringRef local_160;
  StringRef local_140;
  StringRef local_120;
  StringRef local_110;
  StringRef local_100;
  StringRef local_e0;
  allocator<char> local_c9;
  string local_c8 [64];
  string local_88 [32];
  string local_68 [32];
  string local_48 [31];
  undefined1 in_stack_ffffffffffffffd7;
  undefined7 in_stack_ffffffffffffffd8;
  JunitReporter *this_00;
  
  bVar1 = in_R8B & 1;
  trim((string *)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58));
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58),
                   (char)((ulong)in_stack_fffffffffffffc50 >> 0x38));
    std::operator+(in_stack_fffffffffffffc48,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffc40);
    std::__cxx11::string::operator=(local_48,local_68);
    std::__cxx11::string::~string(local_68);
    std::__cxx11::string::~string(local_88);
  }
  bVar2 = CumulativeReporterBase::SectionNode::hasAnyAssertions(in_stack_fffffffffffffc50);
  if (((bVar2) || (uVar3 = std::__cxx11::string::empty(), (uVar3 & 1) == 0)) ||
     (uVar3 = std::__cxx11::string::empty(), (uVar3 & 1) == 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,in_stack_fffffffffffffc70);
    operator|(Newline,Indent);
    XmlWriter::scopedElement
              (in_stack_fffffffffffffc68,(string *)in_stack_fffffffffffffc60,
               in_stack_fffffffffffffc5c);
    std::__cxx11::string::~string(local_c8);
    std::allocator<char>::~allocator(&local_c9);
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      in_stack_fffffffffffffca0 = in_RDI + 0xb0;
      local_120 = operator____sr((char *)in_stack_fffffffffffffc40,(size_t)in_stack_fffffffffffffc38
                                );
      StringRef::StringRef
                ((StringRef *)in_stack_fffffffffffffc40,(string *)in_stack_fffffffffffffc38);
      name_03.m_size = in_stack_fffffffffffffca0;
      name_03.m_start = in_stack_fffffffffffffc98;
      attribute_02.m_size = in_stack_fffffffffffffc90;
      attribute_02.m_start = in_stack_fffffffffffffc88;
      XmlWriter::writeAttribute(in_stack_fffffffffffffc80,name_03,attribute_02);
      in_stack_fffffffffffffc98 = (char *)(in_RDI + 0xb0);
      local_140 = operator____sr((char *)in_stack_fffffffffffffc40,(size_t)in_stack_fffffffffffffc38
                                );
      StringRef::StringRef
                ((StringRef *)in_stack_fffffffffffffc40,(string *)in_stack_fffffffffffffc38);
      name_04.m_size = in_stack_fffffffffffffca0;
      name_04.m_start = in_stack_fffffffffffffc98;
      attribute_03.m_size = in_stack_fffffffffffffc90;
      attribute_03.m_start = in_stack_fffffffffffffc88;
      XmlWriter::writeAttribute(in_stack_fffffffffffffc80,name_04,attribute_03);
    }
    else {
      local_e0 = operator____sr((char *)in_stack_fffffffffffffc40,(size_t)in_stack_fffffffffffffc38)
      ;
      StringRef::StringRef
                ((StringRef *)in_stack_fffffffffffffc40,(string *)in_stack_fffffffffffffc38);
      name_01.m_size = in_stack_fffffffffffffca0;
      name_01.m_start = in_stack_fffffffffffffc98;
      attribute_00.m_size = in_stack_fffffffffffffc90;
      attribute_00.m_start = in_stack_fffffffffffffc88;
      XmlWriter::writeAttribute(in_stack_fffffffffffffc80,name_01,attribute_00);
      local_100 = operator____sr((char *)in_stack_fffffffffffffc40,(size_t)in_stack_fffffffffffffc38
                                );
      local_110 = operator____sr((char *)in_stack_fffffffffffffc40,(size_t)in_stack_fffffffffffffc38
                                );
      name_02.m_size = in_stack_fffffffffffffca0;
      name_02.m_start = in_stack_fffffffffffffc98;
      attribute_01.m_size = in_stack_fffffffffffffc90;
      attribute_01.m_start = in_stack_fffffffffffffc88;
      XmlWriter::writeAttribute(in_stack_fffffffffffffc80,name_02,attribute_01);
    }
    sVar4 = in_RDI + 0xb0;
    local_160 = operator____sr((char *)in_stack_fffffffffffffc40,(size_t)in_stack_fffffffffffffc38);
    (anonymous_namespace)::formatDuration_abi_cxx11_((double)in_stack_fffffffffffffc88);
    StringRef::StringRef((StringRef *)in_stack_fffffffffffffc40,(string *)in_stack_fffffffffffffc38)
    ;
    name_05.m_size = in_stack_fffffffffffffca0;
    name_05.m_start = in_stack_fffffffffffffc98;
    attribute_04.m_size = sVar4;
    attribute_04.m_start = in_stack_fffffffffffffc88;
    XmlWriter::writeAttribute(in_stack_fffffffffffffc80,name_05,attribute_04);
    std::__cxx11::string::~string(local_190);
    pcVar5 = (char *)(in_RDI + 0xb0);
    local_1e1._65_16_ =
         (undefined1  [16])
         operator____sr((char *)in_stack_fffffffffffffc40,(size_t)in_stack_fffffffffffffc38);
    local_1e1._49_16_ =
         (undefined1  [16])
         operator____sr((char *)in_stack_fffffffffffffc40,(size_t)in_stack_fffffffffffffc38);
    name_06.m_size = in_stack_fffffffffffffca0;
    name_06.m_start = in_stack_fffffffffffffc98;
    attribute_05.m_size = sVar4;
    attribute_05.m_start = pcVar5;
    XmlWriter::writeAttribute(in_stack_fffffffffffffc80,name_06,attribute_05);
    if (*(long *)(in_RCX + 2) != 0) {
      in_stack_fffffffffffffc78 = (char *)(in_RDI + 0xb0);
      in_stack_fffffffffffffc80 = (XmlWriter *)local_1e1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,in_stack_fffffffffffffc70);
      operator|(Newline,Indent);
      XmlWriter::scopedElement
                (in_stack_fffffffffffffc68,(string *)in_stack_fffffffffffffc60,
                 in_stack_fffffffffffffc5c);
      StringRef::StringRef((StringRef *)in_stack_fffffffffffffc50,(char *)in_stack_fffffffffffffc48)
      ;
      StringRef::StringRef((StringRef *)in_stack_fffffffffffffc50,(char *)in_stack_fffffffffffffc48)
      ;
      name_00.m_size = (size_type)in_stack_fffffffffffffc80;
      name_00.m_start = in_stack_fffffffffffffc78;
      attribute.m_size = (size_type)in_stack_fffffffffffffc70;
      attribute.m_start = &in_stack_fffffffffffffc68->m_tagIsOpen;
      XmlWriter::ScopedElement::writeAttribute
                ((ScopedElement *)in_stack_fffffffffffffc60,name_00,attribute);
      XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)in_stack_fffffffffffffc40);
      std::__cxx11::string::~string((string *)(local_1e1 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_1e1);
    }
    fmt = (XmlFormatting)((ulong)in_stack_fffffffffffffc48 >> 0x20);
    writeAssertions(in_stack_fffffffffffffc60,
                    (SectionNode *)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58));
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      in_stack_fffffffffffffc68 = (XmlWriter *)(in_RDI + 0xb0);
      in_stack_fffffffffffffc70 = &local_239;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,in_stack_fffffffffffffc70);
      operator|(Newline,Indent);
      XmlWriter::scopedElement
                (in_stack_fffffffffffffc68,(string *)in_stack_fffffffffffffc60,
                 in_stack_fffffffffffffc5c);
      trim((string *)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58));
      StringRef::StringRef
                ((StringRef *)in_stack_fffffffffffffc40,(string *)in_stack_fffffffffffffc38);
      text.m_start._4_4_ = in_stack_fffffffffffffc5c;
      text.m_start._0_4_ = in_stack_fffffffffffffc58;
      text.m_size = (size_type)in_stack_fffffffffffffc60;
      XmlWriter::ScopedElement::writeText((ScopedElement *)in_stack_fffffffffffffc50,text,fmt);
      std::__cxx11::string::~string(local_270);
      XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)in_stack_fffffffffffffc40);
      std::__cxx11::string::~string(local_238);
      std::allocator<char>::~allocator(&local_239);
    }
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      str = (string *)(in_RDI + 0xb0);
      name_07 = (string *)local_2a1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,in_stack_fffffffffffffc70);
      operator|(Newline,Indent);
      XmlWriter::scopedElement
                (in_stack_fffffffffffffc68,name_07,(XmlFormatting)((ulong)str >> 0x20));
      trim(str);
      StringRef::StringRef
                ((StringRef *)in_stack_fffffffffffffc40,(string *)in_stack_fffffffffffffc38);
      text_00.m_size = (size_type)name_07;
      text_00.m_start = (char *)str;
      XmlWriter::ScopedElement::writeText((ScopedElement *)in_stack_fffffffffffffc50,text_00,fmt);
      std::__cxx11::string::~string(local_2d8);
      XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)in_stack_fffffffffffffc40);
      std::__cxx11::string::~string((string *)(local_2a1 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_2a1);
    }
    XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)in_stack_fffffffffffffc40);
  }
  local_2e0 = in_RCX + 3;
  local_2e8._M_current =
       (unique_ptr<Catch::CumulativeReporterBase::SectionNode> *)
       std::
       vector<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
       ::begin((vector<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
                *)in_stack_fffffffffffffc38);
  local_2f0 = (unique_ptr<Catch::CumulativeReporterBase::SectionNode> *)
              std::
              vector<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
              ::end((vector<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
                     *)in_stack_fffffffffffffc38);
  while (bVar2 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>_*,_std::vector<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>_>_>_>
                             *)in_stack_fffffffffffffc40,
                            (__normal_iterator<const_Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>_*,_std::vector<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>_>_>_>
                             *)in_stack_fffffffffffffc38), bVar2) {
    local_2f8 = __gnu_cxx::
                __normal_iterator<const_Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>_*,_std::vector<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>_>_>_>
                ::operator*(&local_2e8);
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      this_00 = in_RSI;
      in_stack_fffffffffffffc40 =
           Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>::operator*(local_2f8);
      writeSection(this_00,in_RDX,in_RCX,(SectionNode *)CONCAT17(bVar1,in_stack_ffffffffffffffd8),
                   (bool)in_stack_ffffffffffffffd7);
      in_stack_fffffffffffffc38 = in_RSI;
      in_RSI = this_00;
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,in_stack_fffffffffffffc70);
      Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>::operator*(local_2f8);
      writeSection(in_RSI,in_RDX,in_RCX,(SectionNode *)CONCAT17(bVar1,in_stack_ffffffffffffffd8),
                   (bool)in_stack_ffffffffffffffd7);
      std::__cxx11::string::~string(local_318);
      std::allocator<char>::~allocator(&local_319);
    }
    __gnu_cxx::
    __normal_iterator<const_Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>_*,_std::vector<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>_>_>_>
    ::operator++(&local_2e8);
  }
  std::__cxx11::string::~string(local_48);
  return;
}

Assistant:

void JunitReporter::writeSection( std::string const& className,
                                      std::string const& rootName,
                                      SectionNode const& sectionNode,
                                      bool testOkToFail) {
        std::string name = trim( sectionNode.stats.sectionInfo.name );
        if( !rootName.empty() )
            name = rootName + '/' + name;

        if( sectionNode.hasAnyAssertions()
           || !sectionNode.stdOut.empty()
           || !sectionNode.stdErr.empty() ) {
            XmlWriter::ScopedElement e = xml.scopedElement( "testcase" );
            if( className.empty() ) {
                xml.writeAttribute( "classname"_sr, name );
                xml.writeAttribute( "name"_sr, "root"_sr );
            }
            else {
                xml.writeAttribute( "classname"_sr, className );
                xml.writeAttribute( "name"_sr, name );
            }
            xml.writeAttribute( "time"_sr, formatDuration( sectionNode.stats.durationInSeconds ) );
            // This is not ideal, but it should be enough to mimic gtest's
            // junit output.
            // Ideally the JUnit reporter would also handle `skipTest`
            // events and write those out appropriately.
            xml.writeAttribute( "status"_sr, "run"_sr );

            if (sectionNode.stats.assertions.failedButOk) {
                xml.scopedElement("skipped")
                    .writeAttribute("message", "TEST_CASE tagged with !mayfail");
            }

            writeAssertions( sectionNode );


            if( !sectionNode.stdOut.empty() )
                xml.scopedElement( "system-out" ).writeText( trim( sectionNode.stdOut ), XmlFormatting::Newline );
            if( !sectionNode.stdErr.empty() )
                xml.scopedElement( "system-err" ).writeText( trim( sectionNode.stdErr ), XmlFormatting::Newline );
        }
        for( auto const& childNode : sectionNode.childSections )
            if( className.empty() )
                writeSection( name, "", *childNode, testOkToFail );
            else
                writeSection( className, name, *childNode, testOkToFail );
    }